

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereIsCoveringIndexWalkCallback(Walker *pWalk,Expr *pExpr)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  CoveringIndexCheck *pCk;
  u16 nColumn;
  i16 *aiColumn;
  Index *pIdx;
  int i;
  int in_stack_ffffffffffffffbc;
  Index *pIdx_00;
  undefined6 in_stack_ffffffffffffffc8;
  int local_1c;
  int local_4;
  
  pIdx_00 = *(Index **)(in_RDI + 0x28);
  if ((*in_RSI == -0x58) || (*in_RSI == -0x56)) {
    if (*(int *)(in_RSI + 0x2c) == *(int *)&pIdx_00->aiColumn) {
      for (local_1c = 0; local_1c < (int)(uint)*(ushort *)(**(long **)(in_RDI + 0x28) + 0x60);
          local_1c = local_1c + 1) {
        if (*(short *)(*(long *)(**(long **)(in_RDI + 0x28) + 8) + (long)local_1c * 2) ==
            *(short *)(in_RSI + 0x30)) {
          return 0;
        }
      }
      *(undefined1 *)((long)&pIdx_00->aiColumn + 5) = 1;
      local_4 = 2;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    if (((*(ushort *)(pIdx_00->zName + 99) >> 0xc & 1) != 0) &&
       (iVar1 = exprIsCoveredByIndex
                          ((Expr *)CONCAT26(0xaaaa,in_stack_ffffffffffffffc8),pIdx_00,
                           in_stack_ffffffffffffffbc), iVar1 != 0)) {
      *(undefined1 *)((long)&pIdx_00->aiColumn + 4) = 1;
      return 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int whereIsCoveringIndexWalkCallback(Walker *pWalk, Expr *pExpr){
  int i;                    /* Loop counter */
  const Index *pIdx;        /* The index of interest */
  const i16 *aiColumn;      /* Columns contained in the index */
  u16 nColumn;              /* Number of columns in the index */
  CoveringIndexCheck *pCk;  /* Info about this search */

  pCk = pWalk->u.pCovIdxCk;
  pIdx = pCk->pIdx;
  if( (pExpr->op==TK_COLUMN || pExpr->op==TK_AGG_COLUMN) ){
    /* if( pExpr->iColumn<(BMS-1) && pIdx->bHasExpr==0 ) return WRC_Continue;*/
    if( pExpr->iTable!=pCk->iTabCur ) return WRC_Continue;
    pIdx = pWalk->u.pCovIdxCk->pIdx;
    aiColumn = pIdx->aiColumn;
    nColumn = pIdx->nColumn;
    for(i=0; i<nColumn; i++){
      if( aiColumn[i]==pExpr->iColumn ) return WRC_Continue;
    }
    pCk->bUnidx = 1;
    return WRC_Abort;
  }else if( pIdx->bHasExpr
         && exprIsCoveredByIndex(pExpr, pIdx, pWalk->u.pCovIdxCk->iTabCur) ){
    pCk->bExpr = 1;
    return WRC_Prune;
  }
  return WRC_Continue;
}